

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void __thiscall
ParamsWrapper<CNetAddr::SerParams,_CService>::Serialize<VectorWriter>
          (ParamsWrapper<CNetAddr::SerParams,_CService> *this,VectorWriter *s)

{
  long in_FS_OFFSET;
  ParamsStream<VectorWriter_&,_CNetAddr::SerParams> ss;
  SerParams *local_18;
  VectorWriter *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = this->m_params;
  local_10 = s;
  CService::
  SerializationOps<ParamsStream<VectorWriter&,CNetAddr::SerParams>,CService_const,ActionSerialize>
            (this->m_object,&local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Serialize(Stream& s) const
    {
        ParamsStream ss{s, m_params};
        ::Serialize(ss, m_object);
    }